

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateAccessorDeclarations
          (StringFieldGenerator *this,Printer *printer)

{
  FieldDescriptor **args;
  CType CVar1;
  FieldDescriptor *field;
  CType CVar2;
  Formatter format;
  Formatter local_60;
  
  local_60.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_60.vars_._M_t,&(this->super_FieldGenerator).variables_._M_t);
  field = (this->super_FieldGenerator).descriptor_;
  CVar1 = *(CType *)(*(long *)(field + 0x38) + 0x48);
  CVar2 = EffectiveStringCType(field,(this->super_FieldGenerator).options_);
  if (CVar1 != CVar2) {
    io::Printer::Outdent(local_60.printer_);
    Formatter::operator()<>(&local_60," private:\n  // Hidden due to unknown ctype option.\n");
    io::Printer::Indent(local_60.printer_);
  }
  args = &(this->super_FieldGenerator).descriptor_;
  Formatter::operator()
            (&local_60,
             "$deprecated_attr$const std::string& ${1$$name$$}$() const;\ntemplate <typename ArgT0 = const std::string&, typename... ArgT>\n$deprecated_attr$void ${1$set_$name$$}$(ArgT0&& arg0, ArgT... args);\n"
             ,args);
  Formatter::operator()
            (&local_60,
             "$deprecated_attr$std::string* ${1$mutable_$name$$}$();\nPROTOBUF_NODISCARD $deprecated_attr$std::string* ${1$$release_name$$}$();\n$deprecated_attr$void ${1$set_allocated_$name$$}$(std::string* $name$);\n"
             ,args);
  Formatter::operator()<>
            (&local_60,
             "private:\nconst std::string& _internal_$name$() const;\ninline PROTOBUF_ALWAYS_INLINE void _internal_set_$name$(const std::string& value);\nstd::string* _internal_mutable_$name$();\n"
            );
  if (this->inlined_ == true) {
    Formatter::operator()<>
              (&local_60,"inline PROTOBUF_ALWAYS_INLINE bool _internal_$name$_donated() const;\n");
  }
  Formatter::operator()<>(&local_60,"public:\n");
  if (CVar1 != CVar2) {
    io::Printer::Outdent(local_60.printer_);
    Formatter::operator()<>(&local_60," public:\n");
    io::Printer::Indent(local_60.printer_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60.vars_._M_t);
  return;
}

Assistant:

void StringFieldGenerator::GenerateAccessorDeclarations(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  // If we're using StringFieldGenerator for a field with a ctype, it's
  // because that ctype isn't actually implemented.  In particular, this is
  // true of ctype=CORD and ctype=STRING_PIECE in the open source release.
  // We aren't releasing Cord because it has too many Google-specific
  // dependencies and we aren't releasing StringPiece because it's hardly
  // useful outside of Google and because it would get confusing to have
  // multiple instances of the StringPiece class in different libraries (PCRE
  // already includes it for their C++ bindings, which came from Google).
  //
  // In any case, we make all the accessors private while still actually
  // using a string to represent the field internally.  This way, we can
  // guarantee that if we do ever implement the ctype, it won't break any
  // existing users who might be -- for whatever reason -- already using .proto
  // files that applied the ctype.  The field can still be accessed via the
  // reflection interface since the reflection interface is independent of
  // the string's underlying representation.

  bool unknown_ctype = descriptor_->options().ctype() !=
                       EffectiveStringCType(descriptor_, options_);

  if (unknown_ctype) {
    format.Outdent();
    format(
        " private:\n"
        "  // Hidden due to unknown ctype option.\n");
    format.Indent();
  }

  format(
      "$deprecated_attr$const std::string& ${1$$name$$}$() const;\n"
      "template <typename ArgT0 = const std::string&, typename... ArgT>\n"
      "$deprecated_attr$void ${1$set_$name$$}$(ArgT0&& arg0, ArgT... args);\n",
      descriptor_);
  format(
      "$deprecated_attr$std::string* ${1$mutable_$name$$}$();\n"
      "PROTOBUF_NODISCARD $deprecated_attr$std::string* "
      "${1$$release_name$$}$();\n"
      "$deprecated_attr$void ${1$set_allocated_$name$$}$(std::string* "
      "$name$);\n",
      descriptor_);
  format(
      "private:\n"
      "const std::string& _internal_$name$() const;\n"
      "inline PROTOBUF_ALWAYS_INLINE void "
      "_internal_set_$name$(const std::string& value);\n"
      "std::string* _internal_mutable_$name$();\n");
  if (inlined_) {
    format(
        "inline PROTOBUF_ALWAYS_INLINE bool _internal_$name$_donated() "
        "const;\n");
  }
  format("public:\n");

  if (unknown_ctype) {
    format.Outdent();
    format(" public:\n");
    format.Indent();
  }
}